

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int IoCommandWriteCnf2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  ulong uVar5;
  char *pcVar6;
  uint fVerbose;
  char *pcVar7;
  uint fAddOrCla;
  uint local_44;
  
  local_44 = 0;
  Extra_UtilGetoptReset();
  bVar1 = true;
  uVar5 = 8;
  fAddOrCla = 1;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"Kaiovh"), iVar4 = globalUtilOptind, iVar2 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 < 0x61) break;
      if (iVar2 == 0x61) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else if (iVar2 == 0x69) {
        local_44 = local_44 ^ 1;
      }
      else {
        if (iVar2 != 0x6f) goto LAB_0032a473;
        fAddOrCla = fAddOrCla ^ 1;
      }
    }
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"IoCommandWriteCnf2(): There is no AIG.\n");
        return 1;
      }
      if (pAbc->pGia->nRegs < 1) {
        if ((int)uVar5 - 9U < 0xfffffffa) {
          Abc_Print(-1,"IoCommandWriteCnf2(): Invalid LUT size (%d).\n");
          return 0;
        }
        if ((bVar1) || (iVar4 = Sdm_ManCanRead(), iVar4 != 0)) {
          if (globalUtilOptind + 1 == argc) {
            pcVar6 = argv[globalUtilOptind];
            __stream = fopen(pcVar6,"wb");
            if (__stream == (FILE *)0x0) {
              printf("Cannot open file \"%s\" for writing.\n",pcVar6);
              return 0;
            }
            fclose(__stream);
            if (bVar1) {
              Mf_ManDumpCnf(pAbc->pGia,pcVar6,(int)uVar5,local_44,fAddOrCla,fVerbose);
            }
            else {
              Jf_ManDumpCnf(pAbc->pGia,pcVar6,fVerbose);
            }
            return 0;
          }
          goto LAB_0032a473;
        }
        pcVar6 = "IoCommandWriteCnf2(): Cannot input precomputed DSD information.\n";
      }
      else {
        pcVar6 = "IoCommandWriteCnf2(): Works only for combinational miters.\n";
      }
      Abc_Print(-1,pcVar6);
      return 0;
    }
    if (iVar2 != 0x4b) goto LAB_0032a473;
    if (argc <= globalUtilOptind) break;
    uVar3 = atoi(argv[globalUtilOptind]);
    uVar5 = (ulong)uVar3;
    globalUtilOptind = iVar4 + 1;
  }
  Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
LAB_0032a473:
  fwrite("usage: &write_cnf [-Kaiovh] <file>\n",0x23,1,(FILE *)pAbc->Err);
  fwrite("\t           writes CNF produced by a new generator\n",0x33,1,(FILE *)pAbc->Err);
  fprintf((FILE *)pAbc->Err,"\t-K <num> : the LUT size (3 <= num <= 8) [default = %d]\n",uVar5);
  pcVar7 = "yes";
  pcVar6 = "yes";
  if (!bVar1) {
    pcVar6 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-a       : toggle using new algorithm [default = %s]\n",pcVar6);
  pcVar6 = "yes";
  if (local_44 == 0) {
    pcVar6 = "no";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-i       : toggle using AIG object IDs as CNF variables [default = %s]\n",pcVar6);
  pcVar6 = "yes";
  if (fAddOrCla == 0) {
    pcVar6 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-o       : toggle adding OR clause for the outputs [default = %s]\n",
          pcVar6);
  if (fVerbose == 0) {
    pcVar7 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
          pcVar7);
  fwrite("\t-h       : print the help massage\n",0x23,1,(FILE *)pAbc->Err);
  fwrite("\tfile     : the name of the file to write\n",0x2a,1,(FILE *)pAbc->Err);
  fputc(10,(FILE *)pAbc->Err);
  fwrite("\t           CNF variable mapping rules:\n",0x28,1,(FILE *)pAbc->Err);
  fputc(10,(FILE *)pAbc->Err);
  fwrite("\t           Assume CNF has N variables, with variable IDs running from 0 to N-1.\n",0x51,
         1,(FILE *)pAbc->Err);
  fwrite("\t           Variable number 0 is not used in the CNF.\n",0x36,1,(FILE *)pAbc->Err);
  fwrite("\t           Variables 1, 2, 3,... <nPOs> represent POs in their natural order.\n",0x4f,1,
         (FILE *)pAbc->Err);
  fwrite("\t           Variables N-<nPIs>, N-<nPIs>+1, N-<nPIs>+2, ... N-1, represent PIs in their natural order.\n"
         ,0x67,1,(FILE *)pAbc->Err);
  fwrite("\t           The internal variables are ordered in a reverse topological order from outputs to inputs.\n"
         ,0x66,1,(FILE *)pAbc->Err);
  fwrite("\t           That is, smaller variable IDs tend to be closer to the outputs, while larger\n"
         ,0x59,1,(FILE *)pAbc->Err);
  fwrite("\t           variable IDs tend to be closer to the inputs. It was found that this ordering\n"
         ,0x5a,1,(FILE *)pAbc->Err);
  fwrite("\t           leads to faster SAT solving for hard UNSAT CEC problems.\n",0x45,1,
         (FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandWriteCnf2( Abc_Frame_t * pAbc, int argc, char **argv )
{
    extern void Jf_ManDumpCnf( Gia_Man_t * p, char * pFileName, int fVerbose );
    extern void Mf_ManDumpCnf( Gia_Man_t * p, char * pFileName, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
    FILE * pFile;
    char * pFileName;
    int nLutSize    = 8;
    int fNewAlgo    = 1;
    int fCnfObjIds  = 0;
    int fAddOrCla   = 1;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kaiovh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'K':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                    goto usage;
                }
                nLutSize = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                break;
            case 'a':
                fNewAlgo ^= 1;
                break;
            case 'i':
                fCnfObjIds ^= 1;
                break;
            case 'o':
                fAddOrCla ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): There is no AIG.\n" );
        return 1;
    } 
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): Works only for combinational miters.\n" );
        return 0;
    }
    if ( nLutSize < 3 || nLutSize > 8 )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): Invalid LUT size (%d).\n", nLutSize );
        return 0;
    }
    if ( !fNewAlgo && !Sdm_ManCanRead() )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): Cannot input precomputed DSD information.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return 0;
    }
    fclose( pFile );
    if ( fNewAlgo )
        Mf_ManDumpCnf( pAbc->pGia, pFileName, nLutSize, fCnfObjIds, fAddOrCla, fVerbose );
    else
        Jf_ManDumpCnf( pAbc->pGia, pFileName, fVerbose );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: &write_cnf [-Kaiovh] <file>\n" );
    fprintf( pAbc->Err, "\t           writes CNF produced by a new generator\n" );
    fprintf( pAbc->Err, "\t-K <num> : the LUT size (3 <= num <= 8) [default = %d]\n", nLutSize );
    fprintf( pAbc->Err, "\t-a       : toggle using new algorithm [default = %s]\n", fNewAlgo? "yes" : "no" );
    fprintf( pAbc->Err, "\t-i       : toggle using AIG object IDs as CNF variables [default = %s]\n", fCnfObjIds? "yes" : "no" );
    fprintf( pAbc->Err, "\t-o       : toggle adding OR clause for the outputs [default = %s]\n", fAddOrCla? "yes" : "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes" : "no" );
    fprintf( pAbc->Err, "\t-h       : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile     : the name of the file to write\n" );
    fprintf( pAbc->Err, "\n" );
    fprintf( pAbc->Err, "\t           CNF variable mapping rules:\n" );
    fprintf( pAbc->Err, "\n" );
    fprintf( pAbc->Err, "\t           Assume CNF has N variables, with variable IDs running from 0 to N-1.\n" );
    fprintf( pAbc->Err, "\t           Variable number 0 is not used in the CNF.\n" );
    fprintf( pAbc->Err, "\t           Variables 1, 2, 3,... <nPOs> represent POs in their natural order.\n" );
    fprintf( pAbc->Err, "\t           Variables N-<nPIs>, N-<nPIs>+1, N-<nPIs>+2, ... N-1, represent PIs in their natural order.\n" );
    fprintf( pAbc->Err, "\t           The internal variables are ordered in a reverse topological order from outputs to inputs.\n" );
    fprintf( pAbc->Err, "\t           That is, smaller variable IDs tend to be closer to the outputs, while larger\n" );
    fprintf( pAbc->Err, "\t           variable IDs tend to be closer to the inputs. It was found that this ordering\n" );
    fprintf( pAbc->Err, "\t           leads to faster SAT solving for hard UNSAT CEC problems.\n" );
    return 1;
}